

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O2

Vec4 __thiscall
vkt::BindingModel::anon_unknown_1::ImageSampleInstanceImages::getSamplePos
          (ImageSampleInstanceImages *this,VkImageViewType viewType,deUint32 baseMipLevel,
          deUint32 baseArraySlice,int samplePosNdx)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar5 [16];
  float fVar6;
  ulong in_XMM1_Qa;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ulong uVar13;
  Vec4 VVar14;
  deUint32 slices [4];
  float local_48 [4];
  float fStack_38;
  float fStack_34;
  float local_30;
  float local_2c;
  float fStack_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  uVar3 = 0x40 >> ((byte)baseMipLevel & 0x1f);
  uVar2 = 1;
  if ((viewType & ~VK_IMAGE_VIEW_TYPE_2D) == VK_IMAGE_VIEW_TYPE_1D_ARRAY) {
    uVar2 = (ulong)(2 - baseArraySlice);
  }
  if (viewType == VK_IMAGE_VIEW_TYPE_CUBE_ARRAY) {
    uVar2 = (ulong)(2 - baseArraySlice);
  }
  if (viewType < VK_IMAGE_VIEW_TYPE_LAST) {
    if ((0x37U >> (viewType & 0x1f) & 1) == 0) {
      local_48[2] = (float)(int)uVar3;
      local_48[0] = 0.75;
      local_48[1] = 0.5;
      local_48[3] = (float)(uVar3 + 0xf & 0xd) + 0.25;
      fStack_38 = 0.0;
      uVar4 = uVar3 + 0x7f;
      fStack_34 = (float)(uVar3 - 1 & 0x10) + 0.5;
      local_30 = 0.0;
      local_2c = (float)(uVar4 & 0x54) + 0.5;
      fStack_28 = (float)(uVar3 + 0xf & 10) + 0.75;
      fStack_24 = local_48[2];
      fStack_20 = (float)(uVar4 & 0x4b) + 0.25;
      fStack_1c = (float)(uVar4 & 0x53) + 0.75;
      slices[0] = (uint)((int)uVar2 != 1);
      slices[1] = (deUint32)(2 % uVar2);
      slices[2] = (deUint32)(9 % uVar2);
      slices[3] = (deUint32)(5 % uVar2);
      lVar1 = (long)samplePosNdx;
      uVar3 = slices[lVar1];
      fVar6 = local_48[lVar1 * 3 + 2] / local_48[2] + local_48[lVar1 * 3 + 2] / local_48[2] + -1.0;
      in_XMM1_Qa = (ulong)(uint)fVar6;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = *(ulong *)(local_48 + lVar1 * 3);
      auVar10._0_8_ = CONCAT44(local_48[2],local_48[2]);
      auVar10._8_4_ = local_48[2];
      auVar10._12_4_ = local_48[2];
      auVar12 = divps(auVar11,auVar10);
      (this->super_ImageInstanceImages).m_viewType =
           (VkImageViewType)(auVar12._0_4_ + auVar12._0_4_ + -1.0);
      (this->super_ImageInstanceImages).m_baseMipLevel =
           (deUint32)(auVar12._4_4_ + auVar12._4_4_ + -1.0);
      (this->super_ImageInstanceImages).m_baseArraySlice = (deUint32)fVar6;
      (this->super_ImageInstanceImages).m_imageFormat.order = (ChannelOrder)(float)uVar3;
      auVar12._0_8_ = auVar10._0_8_;
      goto LAB_0055f20b;
    }
    local_48[0] = 0.75;
    local_48[1] = 0.5;
    uVar4 = uVar3 + 0x7f;
    uVar13 = CONCAT44(uVar3 + 0x1f,uVar3 - 1) & 0x170000000c;
    auVar12._12_4_ = (float)(int)uVar3;
    local_48[2] = (float)(int)uVar13 + 0.25;
    local_48[3] = (float)(int)(uVar13 >> 0x20) + 0.25;
    fStack_38 = (float)(uVar4 & 0x49) + 0.5;
    fStack_34 = (float)(uVar3 + 0x1f & 0x10) + 0.5 + auVar12._12_4_;
    auVar12._0_8_ = CONCAT44(auVar12._12_4_,auVar12._12_4_);
    auVar12._8_4_ = auVar12._12_4_;
    local_30 = 0.25 - (float)(uVar3 - 1 & 0x2b);
    local_2c = auVar12._12_4_ + (float)(uVar4 & 0x54) + 0.5;
    fStack_28 = (float)(uVar4 & 0x75) + 0.75;
    auVar7._0_8_ = CONCAT44(fStack_28,local_2c);
    auVar7._8_4_ = auVar12._12_4_ + 0.5;
    auVar7._12_4_ = (float)(uVar4 & 0x4b) + 0.25;
    fStack_24 = auVar7._8_4_;
    fStack_20 = auVar7._12_4_;
    fStack_1c = (float)(uVar4 & 0x53) + 0.25 + auVar12._12_4_;
    slices[0] = 0;
    slices[1] = (deUint32)(4 % uVar2);
    slices[2] = (deUint32)(9 % uVar2);
    slices[3] = (deUint32)(2 % uVar2);
    auVar8._4_12_ = auVar7._4_12_;
    if ((viewType & ~VK_IMAGE_VIEW_TYPE_1D_ARRAY) == VK_IMAGE_VIEW_TYPE_2D) {
      auVar8._0_4_ = (float)slices[samplePosNdx];
      in_XMM1_Qa = auVar8._0_8_;
    }
    else {
      if ((viewType & ~VK_IMAGE_VIEW_TYPE_1D_ARRAY) == VK_IMAGE_VIEW_TYPE_1D) {
        in_XMM1_Qa = (ulong)(uint)(local_48[(long)samplePosNdx * 3] / auVar12._12_4_);
        auVar5._4_12_ = auVar12._4_12_;
        auVar5._0_4_ = (float)slices[samplePosNdx];
        auVar12._0_8_ = auVar5._0_8_;
        (this->super_ImageInstanceImages).m_viewType =
             (VkImageViewType)(local_48[(long)samplePosNdx * 3] / auVar12._12_4_);
        (this->super_ImageInstanceImages).m_baseMipLevel = (deUint32)auVar5._0_4_;
        (this->super_ImageInstanceImages).m_baseArraySlice = 0;
        (this->super_ImageInstanceImages).m_imageFormat.order = R;
        goto LAB_0055f20b;
      }
      in_XMM1_Qa = auVar7._0_8_;
      if (viewType != VK_IMAGE_VIEW_TYPE_3D) goto LAB_0055f203;
      in_XMM1_Qa = (ulong)(uint)(local_48[(long)samplePosNdx * 3 + 2] / auVar12._12_4_);
    }
    auVar9._8_8_ = 0;
    auVar9._0_8_ = *(ulong *)(local_48 + (long)samplePosNdx * 3);
    auVar10 = divps(auVar9,auVar12);
    (this->super_ImageInstanceImages).m_viewType = (int)auVar10._0_8_;
    (this->super_ImageInstanceImages).m_baseMipLevel = (int)((ulong)auVar10._0_8_ >> 0x20);
    (this->super_ImageInstanceImages).m_baseArraySlice = (deUint32)in_XMM1_Qa;
    (this->super_ImageInstanceImages).m_imageFormat.order = R;
  }
  else {
LAB_0055f203:
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this);
    auVar12._0_8_ = extraout_XMM0_Qa;
  }
LAB_0055f20b:
  VVar14.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar14.m_data[3] = (float)(int)(in_XMM1_Qa >> 0x20);
  VVar14.m_data[0] = (float)(int)auVar12._0_8_;
  VVar14.m_data[1] = (float)(int)((ulong)auVar12._0_8_ >> 0x20);
  return (Vec4)VVar14.m_data;
}

Assistant:

tcu::Vec4 ImageSampleInstanceImages::getSamplePos (vk::VkImageViewType viewType, deUint32 baseMipLevel, deUint32 baseArraySlice, int samplePosNdx)
{
	DE_ASSERT(de::inBounds(samplePosNdx, 0, 4));

	const deUint32	imageSize	= (deUint32)IMAGE_SIZE >> baseMipLevel;
	const deUint32	arraySize	= isImageViewTypeArray(viewType) ? ARRAY_SIZE - baseArraySlice : 1;

	// choose arbitrary values that are not ambiguous with NEAREST filtering

	switch (viewType)
	{
		case vk::VK_IMAGE_VIEW_TYPE_1D:
		case vk::VK_IMAGE_VIEW_TYPE_1D_ARRAY:
		case vk::VK_IMAGE_VIEW_TYPE_2D:
		case vk::VK_IMAGE_VIEW_TYPE_2D_ARRAY:
		case vk::VK_IMAGE_VIEW_TYPE_3D:
		{
			const tcu::Vec3	coords[4]	=
			{
				tcu::Vec3(0.75f,
						  0.5f,
						  (float)(12u % imageSize) + 0.25f),

				tcu::Vec3((float)(23u % imageSize) + 0.25f,
						  (float)(73u % imageSize) + 0.5f,
						  (float)(16u % imageSize) + 0.5f + (float)imageSize),

				tcu::Vec3(-(float)(43u % imageSize) + 0.25f,
						  (float)(84u % imageSize) + 0.5f + (float)imageSize,
						  (float)(117u % imageSize) + 0.75f),

				tcu::Vec3((float)imageSize + 0.5f,
						  (float)(75u % imageSize) + 0.25f,
						  (float)(83u % imageSize) + 0.25f + (float)imageSize),
			};
			const deUint32	slices[4]	=
			{
				0u % arraySize,
				4u % arraySize,
				9u % arraySize,
				2u % arraySize,
			};

			if (viewType == vk::VK_IMAGE_VIEW_TYPE_1D || viewType == vk::VK_IMAGE_VIEW_TYPE_1D_ARRAY)
				return tcu::Vec4(coords[samplePosNdx].x() / (float)imageSize,
								 (float)slices[samplePosNdx],
								 0.0f,
								 0.0f);
			else if (viewType == vk::VK_IMAGE_VIEW_TYPE_2D || viewType == vk::VK_IMAGE_VIEW_TYPE_2D_ARRAY)
				return tcu::Vec4(coords[samplePosNdx].x() / (float)imageSize,
								 coords[samplePosNdx].y() / (float)imageSize,
								 (float)slices[samplePosNdx],
								 0.0f);
			else if (viewType == vk::VK_IMAGE_VIEW_TYPE_3D)
				return tcu::Vec4(coords[samplePosNdx].x() / (float)imageSize,
								 coords[samplePosNdx].y() / (float)imageSize,
								 coords[samplePosNdx].z() / (float)imageSize,
								 0.0f);
			else
			{
				DE_FATAL("Impossible");
				return tcu::Vec4();
			}
		}

		case vk::VK_IMAGE_VIEW_TYPE_CUBE:
		case vk::VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
		{
			// \note these values are in [0, texSize]*3 space for convenience
			const tcu::Vec3	coords[4]	=
			{
				tcu::Vec3(0.75f,
						  0.5f,
						  (float)imageSize),

				tcu::Vec3((float)(13u % imageSize) + 0.25f,
						  0.0f,
						  (float)(16u % imageSize) + 0.5f),

				tcu::Vec3(0.0f,
						  (float)(84u % imageSize) + 0.5f,
						  (float)(10u % imageSize) + 0.75f),

				tcu::Vec3((float)imageSize,
						  (float)(75u % imageSize) + 0.25f,
						  (float)(83u % imageSize) + 0.75f),
			};
			const deUint32	slices[4]	=
			{
				1u % arraySize,
				2u % arraySize,
				9u % arraySize,
				5u % arraySize,
			};

			DE_ASSERT(de::inRange(coords[samplePosNdx].x(), 0.0f, (float)imageSize));
			DE_ASSERT(de::inRange(coords[samplePosNdx].y(), 0.0f, (float)imageSize));
			DE_ASSERT(de::inRange(coords[samplePosNdx].z(), 0.0f, (float)imageSize));

			// map to [-1, 1]*3 space
			return tcu::Vec4(coords[samplePosNdx].x() / (float)imageSize * 2.0f - 1.0f,
							 coords[samplePosNdx].y() / (float)imageSize * 2.0f - 1.0f,
							 coords[samplePosNdx].z() / (float)imageSize * 2.0f - 1.0f,
							 (float)slices[samplePosNdx]);
		}

		default:
			DE_FATAL("Impossible");
			return tcu::Vec4();
	}
}